

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator+(sc_signed *__return_storage_ptr__,long u,sc_unsigned *v)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  small_type s;
  sc_digit ud [3];
  
  if (u == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,v);
  }
  else {
    s = 1;
    if ((u < 1) && (s = 0, u != 0)) {
      s = -1;
      u = -u;
    }
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      ud[uVar3] = (uint)u & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar3) break;
      bVar1 = 0x3fffffff < (ulong)u;
      u = (ulong)u >> 0x1e;
      uVar2 = uVar3 + 1;
    } while (bVar1);
    if (uVar3 < 2) {
      memset(ud + uVar3 + 1,0,__n);
    }
    if (v->sgn == 0) {
      sc_signed::sc_signed(__return_storage_ptr__,s,0x40,3,ud,false);
    }
    else {
      add_signed_friend(__return_storage_ptr__,s,0x40,3,ud,v->sgn,v->nbits,v->ndigits,v->digit);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator+(long u, const sc_unsigned &v)
{

  if (u == 0) // case 1
    return sc_signed(v);

  CONVERT_LONG(u);

  if (v.sgn == SC_ZERO)  // case 2
    return sc_signed(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud, false);

  // cases 3 and 4
  return add_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}